

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_object.cc
# Opt level: O3

ASN1_OBJECT * d2i_ASN1_OBJECT(ASN1_OBJECT **a,uchar **pp,long length)

{
  int iVar1;
  ASN1_OBJECT *pAVar2;
  uint8_t *contents;
  CBS child;
  CBS cbs;
  uchar *local_38;
  CBS local_30;
  CBS local_20;
  
  if (length < 0) {
    pAVar2 = (ASN1_OBJECT *)0x0;
  }
  else {
    local_20.data = *pp;
    local_20.len = length;
    iVar1 = CBS_get_asn1(&local_20,&local_30,6);
    if (iVar1 == 0) {
      pAVar2 = (ASN1_OBJECT *)0x0;
      ERR_put_error(0xc,0,0x6d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_object.cc"
                    ,100);
    }
    else {
      local_38 = local_30.data;
      pAVar2 = c2i_ASN1_OBJECT(a,&local_38,local_30.len);
      if (pAVar2 != (ASN1_OBJECT *)0x0) {
        if (local_20.data != local_38) {
          __assert_fail("CBS_data(&cbs) == contents",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_object.cc"
                        ,0x6c,
                        "ASN1_OBJECT *d2i_ASN1_OBJECT(ASN1_OBJECT **, const unsigned char **, long)"
                       );
        }
        *pp = local_20.data;
      }
    }
  }
  return pAVar2;
}

Assistant:

ASN1_OBJECT *d2i_ASN1_OBJECT(ASN1_OBJECT **out, const unsigned char **inp,
                             long len) {
  if (len < 0) {
    return NULL;
  }

  CBS cbs, child;
  CBS_init(&cbs, *inp, (size_t)len);
  if (!CBS_get_asn1(&cbs, &child, CBS_ASN1_OBJECT)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
    return NULL;
  }

  const uint8_t *contents = CBS_data(&child);
  ASN1_OBJECT *ret = c2i_ASN1_OBJECT(out, &contents, CBS_len(&child));
  if (ret != NULL) {
    // |c2i_ASN1_OBJECT| should have consumed the entire input.
    assert(CBS_data(&cbs) == contents);
    *inp = CBS_data(&cbs);
  }
  return ret;
}